

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

uint32_t leb__HeapRead(leb_Heap *leb,leb_Node node)

{
  uint uVar1;
  uint uVar2;
  undefined8 in_RDX;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = (node.id - (int)((ulong)in_RDX >> 0x20)) + 1;
  uVar2 = (int)in_RDX * uVar5 + (2 << ((byte)((ulong)in_RDX >> 0x20) & 0x1f));
  uVar4 = uVar2 & 0x1f;
  uVar3 = 0x20 - uVar4;
  if (uVar5 <= uVar3) {
    uVar3 = uVar5;
  }
  if ((uVar3 < 0x20) && (uVar5 - uVar3 < 0x20)) {
    uVar2 = uVar2 >> 5;
    uVar1 = uVar2 + 1;
    uVar6 = ((uint)(1 << ((char)node.id + 2U & 0x1f)) >> 5) - 1;
    if (uVar1 < uVar6) {
      uVar6 = uVar1;
    }
    return (~(-1 << ((byte)(uVar5 - uVar3) & 0x1f)) &
           *(uint *)((long)&leb->buffer + (ulong)uVar6 * 4)) << ((byte)uVar3 & 0x1f) |
           ~(-1 << ((byte)uVar3 & 0x1f)) &
           *(uint *)((long)&leb->buffer + (ulong)uVar2 * 4) >> (sbyte)uVar4;
  }
  __assert_fail("bitOffset < 32u && bitCount < 32u && bitOffset + bitCount <= 32u",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0xc6,"uint32_t leb__BitFieldExtract(const uint32_t, uint32_t, uint32_t)");
}

Assistant:

static uint32_t leb__HeapRead(const leb_Heap *leb, const leb_Node node)
{
    return leb__HeapReadExplicit(leb, node, leb__NodeBitSize(leb, node));
}